

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v5::internal::
container_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
grow(container_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     *this,size_t capacity)

{
  char *buf_data;
  size_t in_RSI;
  basic_buffer<char> *in_RDI;
  
  std::__cxx11::string::resize((ulong)in_RDI[1]._vptr_basic_buffer);
  buf_data = (char *)std::__cxx11::string::operator[]((ulong)in_RDI[1]._vptr_basic_buffer);
  basic_buffer<char>::set(in_RDI,buf_data,in_RSI);
  return;
}

Assistant:

void grow(std::size_t capacity) FMT_OVERRIDE {
    container_.resize(capacity);
    this->set(&container_[0], capacity);
  }